

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSources::UpdateReceiveTime
          (RTPSources *this,uint32_t ssrc,RTPTime *receivetime,RTPAddress *senderaddress)

{
  int iVar1;
  bool created;
  RTPInternalSourceData *srcdat;
  bool local_21;
  RTPInternalSourceData *local_20;
  
  iVar1 = GetRTCPSourceData(this,ssrc,senderaddress,&local_20,&local_21);
  if (((-1 < iVar1) && (local_20 != (RTPInternalSourceData *)0x0)) &&
     ((local_20->super_RTPSourceData).stats.lastmsgtime.m_t = receivetime->m_t, local_21 == true)) {
    (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this);
  }
  return iVar1;
}

Assistant:

int RTPSources::UpdateReceiveTime(uint32_t ssrc,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;
	
	// We got valid SSRC info
	srcdat->UpdateMessageTime(receivetime);
	
	// Call the callback
	if (created)
		OnNewSource(srcdat);

	return 0;
}